

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

string * __thiscall
ot::commissioner::Interpreter::BaAvailabilityToString_abi_cxx11_
          (string *__return_storage_ptr__,Interpreter *this,uint32_t aAvailability)

{
  allocator local_26;
  allocator local_25 [16];
  allocator local_15;
  int local_14;
  string *psStack_10;
  uint32_t aAvailability_local;
  
  local_14 = (int)this;
  psStack_10 = __return_storage_ptr__;
  if (local_14 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"low",&local_15);
    std::allocator<char>::~allocator((allocator<char> *)&local_15);
  }
  else if (local_14 == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"high",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"reserved",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Interpreter::BaAvailabilityToString(uint32_t aAvailability)
{
    switch (aAvailability)
    {
    case 0:
        return "low";
    case 1:
        return "high";
    default:
        return "reserved";
    }
}